

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

void cmac_pad(uchar *padded_block,size_t padded_block_len,uchar *last_block,size_t last_block_len)

{
  ulong local_30;
  size_t j;
  size_t last_block_len_local;
  uchar *last_block_local;
  size_t padded_block_len_local;
  uchar *padded_block_local;
  
  for (local_30 = 0; local_30 < padded_block_len; local_30 = local_30 + 1) {
    if (local_30 < last_block_len) {
      padded_block[local_30] = last_block[local_30];
    }
    else if (local_30 == last_block_len) {
      padded_block[local_30] = 0x80;
    }
    else {
      padded_block[local_30] = '\0';
    }
  }
  return;
}

Assistant:

static void cmac_pad( unsigned char padded_block[MBEDTLS_CIPHER_BLKSIZE_MAX],
                      size_t padded_block_len,
                      const unsigned char *last_block,
                      size_t last_block_len )
{
    size_t j;

    for( j = 0; j < padded_block_len; j++ )
    {
        if( j < last_block_len )
            padded_block[j] = last_block[j];
        else if( j == last_block_len )
            padded_block[j] = 0x80;
        else
            padded_block[j] = 0x00;
    }
}